

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O1

FT_Error T42_GlyphSlot_Load(FT_GlyphSlot glyph,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Outline *pFVar1;
  FT_Module_Class *pFVar2;
  FT_Library pFVar3;
  FT_Module pFVar4;
  FT_Module pFVar5;
  FT_Module pFVar6;
  FT_Module pFVar7;
  FT_Module pFVar8;
  FT_Module pFVar9;
  FT_Module pFVar10;
  int iVar11;
  ulong uVar12;
  
  pFVar2 = glyph->face->driver[1].root.clazz;
  uVar12 = strtol((char *)(&(size->face[2].size)->face)[glyph_index],(char **)0x0,10);
  pFVar3 = glyph[1].library;
  ft_glyphslot_free_bitmap((FT_GlyphSlot)pFVar3);
  (pFVar3->renderers).tail = (FT_ListNode)0x0;
  *(FT_Glyph_Format *)(pFVar3->modules + 0xf) = FT_GLYPH_FORMAT_NONE;
  ((FT_Glyph_Metrics *)(pFVar3->modules + 3))->width = 0;
  pFVar3->modules[4] = (FT_Module)0x0;
  pFVar3->modules[5] = (FT_Module)0x0;
  pFVar3->modules[6] = (FT_Module)0x0;
  pFVar3->modules[7] = (FT_Module)0x0;
  pFVar3->modules[8] = (FT_Module)0x0;
  pFVar3->modules[9] = (FT_Module)0x0;
  pFVar3->modules[10] = (FT_Module)0x0;
  pFVar3->modules[0xb] = (FT_Module)0x0;
  pFVar3->modules[0xc] = (FT_Module)0x0;
  ((FT_Bitmap *)(pFVar3->modules + 0x10))->rows = 0;
  ((FT_Bitmap *)(pFVar3->modules + 0x10))->width = 0;
  pFVar3->modules[0x11] = (FT_Module)0x0;
  pFVar3->modules[0x12] = (FT_Module)0x0;
  pFVar3->modules[0x13] = (FT_Module)0x0;
  pFVar3->modules[0x14] = (FT_Module)0x0;
  pFVar3->modules[0x15] = (FT_Module)0x0;
  pFVar1 = (FT_Outline *)(pFVar3->modules + 0x16);
  pFVar1->n_contours = 0;
  pFVar1->n_points = 0;
  *(undefined4 *)&pFVar1->field_0x4 = 0;
  pFVar3->modules[0x17] = (FT_Module)0x0;
  pFVar3->modules[0x18] = (FT_Module)0x0;
  pFVar3->modules[0x19] = (FT_Module)0x0;
  *(undefined8 *)((long)pFVar3->modules + 0xcc) = 0;
  *(undefined8 *)((long)pFVar3->modules + 0xd4) = 0;
  pFVar3->modules[0x1c] = (FT_Module)0x0;
  pFVar3->modules[0x1d] = (FT_Module)0x0;
  pFVar3->modules[0x1e] = (FT_Module)0x0;
  iVar11 = (*(code *)pFVar2[2].module_flags)
                     (glyph[1].library,size[1].face,uVar12 & 0xffffffff,load_flags | 8);
  if (iVar11 == 0) {
    pFVar3 = glyph[1].library;
    pFVar4 = pFVar3->modules[4];
    pFVar5 = pFVar3->modules[5];
    pFVar6 = pFVar3->modules[6];
    pFVar7 = pFVar3->modules[7];
    pFVar8 = pFVar3->modules[8];
    pFVar9 = pFVar3->modules[9];
    pFVar10 = pFVar3->modules[10];
    (glyph->metrics).width = (FT_Pos)pFVar3->modules[3];
    (glyph->metrics).height = (FT_Pos)pFVar4;
    (glyph->metrics).horiBearingX = (FT_Pos)pFVar5;
    (glyph->metrics).horiBearingY = (FT_Pos)pFVar6;
    (glyph->metrics).horiAdvance = (FT_Pos)pFVar7;
    (glyph->metrics).vertBearingX = (FT_Pos)pFVar8;
    (glyph->metrics).vertBearingY = (FT_Pos)pFVar9;
    (glyph->metrics).vertAdvance = (FT_Pos)pFVar10;
    glyph->linearHoriAdvance = (FT_Fixed)pFVar3->modules[0xb];
    glyph->linearVertAdvance = (FT_Fixed)pFVar3->modules[0xc];
    glyph->format = *(FT_Glyph_Format *)(pFVar3->modules + 0xf);
    *(FT_Module *)&(glyph->outline).flags = pFVar3->modules[0x1a];
    pFVar4 = pFVar3->modules[0x16];
    pFVar5 = pFVar3->modules[0x17];
    pFVar6 = pFVar3->modules[0x19];
    (glyph->outline).tags = (char *)pFVar3->modules[0x18];
    (glyph->outline).contours = (short *)pFVar6;
    *(FT_Module *)&glyph->outline = pFVar4;
    (glyph->outline).points = (FT_Vector *)pFVar5;
    (glyph->bitmap).palette = pFVar3->modules[0x14];
    pFVar4 = pFVar3->modules[0x10];
    pFVar5 = pFVar3->modules[0x11];
    pFVar6 = pFVar3->modules[0x13];
    (glyph->bitmap).buffer = (uchar *)pFVar3->modules[0x12];
    *(FT_Module *)&(glyph->bitmap).num_grays = pFVar6;
    *(FT_Module *)&glyph->bitmap = pFVar4;
    *(FT_Module *)&(glyph->bitmap).pitch = pFVar5;
    glyph->bitmap_left = *(FT_Int *)(pFVar3->modules + 0x15);
    glyph->bitmap_top = *(FT_Int *)((long)pFVar3->modules + 0xac);
    glyph->num_subglyphs = *(FT_UInt *)(pFVar3->modules + 0x1b);
    glyph->subglyphs = (FT_SubGlyph)pFVar3->modules[0x1c];
    glyph->control_data = pFVar3->modules[0x1d];
    glyph->control_len = (long)pFVar3->modules[0x1e];
  }
  return iVar11;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_GlyphSlot_Load( FT_GlyphSlot  glyph,
                      FT_Size       size,
                      FT_UInt       glyph_index,
                      FT_Int32      load_flags )
  {
    FT_Error         error;
    T42_GlyphSlot    t42slot = (T42_GlyphSlot)glyph;
    T42_Size         t42size = (T42_Size)size;
    T42_Face         t42face = (T42_Face)size->face;
    FT_Driver_Class  ttclazz = ((T42_Driver)glyph->face->driver)->ttclazz;


    FT_TRACE1(( "T42_GlyphSlot_Load: glyph index %d\n", glyph_index ));

    /* map T42 glyph index to embedded TTF's glyph index */
    glyph_index = (FT_UInt)ft_strtol(
                    (const char *)t42face->type1.charstrings[glyph_index],
                    NULL, 10 );

    t42_glyphslot_clear( t42slot->ttslot );
    error = ttclazz->load_glyph( t42slot->ttslot,
                                 t42size->ttsize,
                                 glyph_index,
                                 load_flags | FT_LOAD_NO_BITMAP );

    if ( !error )
    {
      glyph->metrics = t42slot->ttslot->metrics;

      glyph->linearHoriAdvance = t42slot->ttslot->linearHoriAdvance;
      glyph->linearVertAdvance = t42slot->ttslot->linearVertAdvance;

      glyph->format  = t42slot->ttslot->format;
      glyph->outline = t42slot->ttslot->outline;

      glyph->bitmap      = t42slot->ttslot->bitmap;
      glyph->bitmap_left = t42slot->ttslot->bitmap_left;
      glyph->bitmap_top  = t42slot->ttslot->bitmap_top;

      glyph->num_subglyphs = t42slot->ttslot->num_subglyphs;
      glyph->subglyphs     = t42slot->ttslot->subglyphs;

      glyph->control_data  = t42slot->ttslot->control_data;
      glyph->control_len   = t42slot->ttslot->control_len;
    }

    return error;
  }